

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_builder_unittest.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::PathBuilderMultiRootTest_TargetWithSameNameAsTrustAnchorFails_Test::TestBody
          (PathBuilderMultiRootTest_TargetWithSameNameAsTrustAnchorFails_Test *this)

{
  shared_ptr<const_bssl::ParsedCertificate> *psVar1;
  bool bVar2;
  string *psVar3;
  char *pcVar4;
  AssertHelper local_1d0;
  AssertHelper local_1c8;
  AssertionResult gtest_ar_;
  VerifyError error;
  __shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2> local_180;
  __shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2> local_170;
  Result result;
  TrustStoreInMemory trust_store;
  CertPathBuilder path_builder;
  
  TrustStoreInMemory::TrustStoreInMemory(&trust_store);
  psVar1 = &(this->super_PathBuilderMultiRootTest).a_by_b_;
  ::std::__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_170,
             &psVar1->super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>)
  ;
  TrustStoreInMemory::AddTrustAnchor
            (&trust_store,(shared_ptr<const_bssl::ParsedCertificate> *)&local_170);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_170._M_refcount);
  ::std::__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_180,
             &psVar1->super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>)
  ;
  pcVar4 = (char *)0x0;
  CertPathBuilder::CertPathBuilder
            (&path_builder,(shared_ptr<const_bssl::ParsedCertificate> *)&local_180,
             &trust_store.super_TrustStore,
             (CertPathBuilderDelegate *)&(this->super_PathBuilderMultiRootTest).delegate_,
             &(this->super_PathBuilderMultiRootTest).time_,ANY_EKU,
             (this->super_PathBuilderMultiRootTest).initial_explicit_policy_,
             &(this->super_PathBuilderMultiRootTest).user_initial_policy_set_,
             (this->super_PathBuilderMultiRootTest).initial_policy_mapping_inhibit_,
             (this->super_PathBuilderMultiRootTest).initial_any_policy_inhibit_);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_180._M_refcount);
  CertPathBuilder::Run(&result,&path_builder);
  bVar2 = CertPathBuilder::Result::HasValidPath(&result);
  gtest_ar_.success_ = !bVar2;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&error,(internal *)&gtest_ar_,(AssertionResult *)"result.HasValidPath()",
               "true","false",pcVar4);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
               ,0x10a,(char *)CONCAT71(error.offset_._1_7_,(char)error.offset_));
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    ::std::__cxx11::string::~string((string *)&error);
    if ((long *)CONCAT44(local_1d0.data_._4_4_,(StatusCode)local_1d0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1d0.data_._4_4_,(StatusCode)local_1d0.data_) + 8))();
    }
  }
  ::std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = true;
  gtest_ar_._1_3_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&error,"1U","result.max_depth_seen",(uint *)&gtest_ar_,
             &result.max_depth_seen);
  if ((char)error.offset_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (error._8_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)error._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
               ,0x10b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
    }
  }
  ::std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&error.code_);
  CertPathBuilder::Result::GetBestPathVerifyError(&error,&result);
  local_1d0.data_._0_4_ = VerifyError::Code(&error);
  local_1c8.data_._0_4_ = 0xb;
  testing::internal::CmpHelperEQ<bssl::VerifyError::StatusCode,bssl::VerifyError::StatusCode>
            ((internal *)&gtest_ar_,"error.Code()","VerifyError::StatusCode::PATH_NOT_FOUND",
             (StatusCode *)&local_1d0,(StatusCode *)&local_1c8);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_1d0);
    psVar3 = VerifyError::DiagnosticString_abi_cxx11_(&error);
    ::std::operator<<((ostream *)
                      (CONCAT44(local_1d0.data_._4_4_,(StatusCode)local_1d0.data_) + 0x10),
                      (string *)psVar3);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
               ,0x10d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if ((long *)CONCAT44(local_1d0.data_._4_4_,(StatusCode)local_1d0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1d0.data_._4_4_,(StatusCode)local_1d0.data_) + 8))();
    }
  }
  ::std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  ::std::__cxx11::string::~string((string *)&error.diagnostic_);
  CertPathBuilder::Result::~Result(&result);
  CertPathBuilder::~CertPathBuilder(&path_builder);
  TrustStoreInMemory::~TrustStoreInMemory(&trust_store);
  return;
}

Assistant:

TEST_F(PathBuilderMultiRootTest, TargetWithSameNameAsTrustAnchorFails) {
  TrustStoreInMemory trust_store;
  trust_store.AddTrustAnchor(a_by_b_);

  CertPathBuilder path_builder(
      a_by_b_, &trust_store, &delegate_, time_, KeyPurpose::ANY_EKU,
      initial_explicit_policy_, user_initial_policy_set_,
      initial_policy_mapping_inhibit_, initial_any_policy_inhibit_);

  auto result = path_builder.Run();

  EXPECT_FALSE(result.HasValidPath());
  EXPECT_EQ(1U, result.max_depth_seen);
  VerifyError error = result.GetBestPathVerifyError();
  ASSERT_EQ(error.Code(), VerifyError::StatusCode::PATH_NOT_FOUND)
      << error.DiagnosticString();
}